

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O2

FT_String * tt_name_ascii_from_utf16(TT_Name entry,FT_Memory memory)

{
  FT_Byte *pFVar1;
  FT_String *pFVar2;
  ulong uVar3;
  ulong uVar4;
  FT_String *pFVar5;
  FT_Byte FVar6;
  uint uVar7;
  ulong uVar8;
  int local_2c [2];
  FT_Error error;
  
  pFVar1 = entry->string;
  uVar8 = (ulong)(entry->stringLength >> 1);
  pFVar2 = (FT_String *)ft_mem_realloc(memory,1,0,uVar8 + 1,(void *)0x0,local_2c);
  pFVar5 = (FT_String *)0x0;
  if (local_2c[0] == 0) {
    for (uVar4 = 0; uVar3 = uVar8, uVar8 != uVar4; uVar4 = uVar4 + 1) {
      FVar6 = pFVar1[uVar4 * 2 + 1];
      uVar7 = (uint)CONCAT11(pFVar1[uVar4 * 2],FVar6);
      uVar3 = uVar4;
      if (uVar7 == 0) break;
      if (uVar7 - 0x80 < 0xffffffa0) {
        FVar6 = '?';
      }
      pFVar2[uVar4] = FVar6;
    }
    pFVar2[uVar3] = '\0';
    pFVar5 = pFVar2;
  }
  return pFVar5;
}

Assistant:

static FT_String*
  tt_name_ascii_from_utf16( TT_Name    entry,
                            FT_Memory  memory )
  {
    FT_String*  string = NULL;
    FT_UInt     len, code, n;
    FT_Byte*    read   = (FT_Byte*)entry->string;
    FT_Error    error;


    len = (FT_UInt)entry->stringLength / 2;

    if ( FT_NEW_ARRAY( string, len + 1 ) )
      return NULL;

    for ( n = 0; n < len; n++ )
    {
      code = FT_NEXT_USHORT( read );

      if ( code == 0 )
        break;

      if ( code < 32 || code > 127 )
        code = '?';

      string[n] = (char)code;
    }

    string[n] = 0;

    return string;
  }